

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O2

SharedPtr<Decorator> __thiscall
Rml::DecoratorLinearGradientInstancer::InstanceDecorator
          (DecoratorLinearGradientInstancer *this,String *name,PropertyDictionary *properties_,
          DecoratorInstancerInterface *param_3)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Property *this_00;
  Property *this_01;
  Property *this_02;
  Property *this_03;
  Property *pPVar4;
  NumericValue value;
  undefined4 uVar5;
  int iVar6;
  DecoratorInstancerInterface *pDVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  Corner in_corner;
  float in_angle;
  undefined1 auVar9 [16];
  SharedPtr<Decorator> SVar10;
  SharedPtr<Rml::DecoratorLinearGradient> decorator;
  
  pDVar7 = param_3;
  this_00 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[8]);
  uVar5 = SUB84(pDVar7,0);
  this_01 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[9]);
  this_02 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[10]);
  this_03 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[0xb]);
  pPVar4 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[0xc]);
  auVar9._0_4_ = -(uint)((int)((ulong)this_00 >> 0x20) == 0 && (int)this_00 == 0);
  auVar9._4_4_ = -(uint)((int)this_01 == 0 && (int)((ulong)this_01 >> 0x20) == 0);
  auVar9._8_4_ = -(uint)((int)((ulong)this_02 >> 0x20) == 0 && (int)this_02 == 0);
  auVar9._12_4_ = -(uint)((int)this_03 == 0 && (int)((ulong)this_03 >> 0x20) == 0);
  iVar6 = movmskps(uVar5,auVar9);
  if (iVar6 != 0 || pPVar4 == (Property *)0x0) {
    (this->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)0x0;
    (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    _Var8._M_pi = extraout_RDX;
    goto LAB_0027312f;
  }
  bVar1 = Property::Get<bool>(this_01);
  if (bVar1) {
    uVar2 = Property::Get<int>(this_02);
    uVar3 = Property::Get<int>(this_03);
    uVar2 = (uVar3 | uVar2) - 1;
    _Var8._M_pi = extraout_RDX_00;
    if ((uVar2 < 0xc) && ((0x9afU >> (uVar2 & 0x1f) & 1) != 0)) {
      in_angle = *(float *)(&DAT_0031ddbc + (ulong)uVar2 * 4);
      in_corner = *(Corner *)(&DAT_0031ddec + (ulong)uVar2 * 4);
      goto LAB_002730a2;
    }
  }
  else {
    value = Property::GetNumericValue(this_00);
    in_angle = ComputeAngle(value);
    in_corner = Count;
    _Var8._M_pi = extraout_RDX_01;
LAB_002730a2:
    if (pPVar4->unit == COLORSTOPLIST) {
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )properties_,"repeating-linear-gradient");
      ::std::make_shared<Rml::DecoratorLinearGradient>();
      bVar1 = DecoratorLinearGradient::Initialise
                        (decorator.
                         super___shared_ptr<Rml::DecoratorLinearGradient,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,bVar1,in_corner,in_angle,(ColorStopList *)(pPVar4->value).data);
      _Var8 = decorator.super___shared_ptr<Rml::DecoratorLinearGradient,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount;
      if (bVar1) {
        decorator.super___shared_ptr<Rml::DecoratorLinearGradient,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (this->super_DecoratorInstancer)._vptr_DecoratorInstancer =
             (_func_int **)
             decorator.super___shared_ptr<Rml::DecoratorLinearGradient,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
        super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var8._M_pi;
        decorator.super___shared_ptr<Rml::DecoratorLinearGradient,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
      }
      else {
        (this->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)0x0;
        (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
        super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&decorator.
                  super___shared_ptr<Rml::DecoratorLinearGradient,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      _Var8._M_pi = extraout_RDX_02;
      goto LAB_0027312f;
    }
  }
  (this->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)0x0;
  (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
  super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
LAB_0027312f:
  SVar10.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  SVar10.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SharedPtr<Decorator>)SVar10.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

SharedPtr<Decorator> DecoratorLinearGradientInstancer::InstanceDecorator(const String& name, const PropertyDictionary& properties_,
	const DecoratorInstancerInterface& /*interface_*/)
{
	const Property* p_angle = properties_.GetProperty(ids.angle);
	const Property* p_direction_to = properties_.GetProperty(ids.direction_to);
	const Property* p_direction_x = properties_.GetProperty(ids.direction_x);
	const Property* p_direction_y = properties_.GetProperty(ids.direction_y);
	const Property* p_color_stop_list = properties_.GetProperty(ids.color_stop_list);

	if (!p_angle || !p_direction_to || !p_direction_x || !p_direction_y || !p_color_stop_list)
		return nullptr;

	using Corner = DecoratorLinearGradient::Corner;
	Corner corner = Corner::None;
	float angle = 0.f;

	if (p_direction_to->Get<bool>())
	{
		const Direction direction = (Direction)(p_direction_x->Get<int>() | p_direction_y->Get<int>());
		switch (direction)
		{
		case Direction::Top: angle = 0.f; break;
		case Direction::Right: angle = 0.5f * Math::RMLUI_PI; break;
		case Direction::Bottom: angle = Math::RMLUI_PI; break;
		case Direction::Left: angle = 1.5f * Math::RMLUI_PI; break;
		case Direction::TopLeft: corner = Corner::TopLeft; break;
		case Direction::TopRight: corner = Corner::TopRight; break;
		case Direction::BottomRight: corner = Corner::BottomRight; break;
		case Direction::BottomLeft: corner = Corner::BottomLeft; break;
		case Direction::None:
		default: return nullptr; break;
		}
	}
	else
	{
		angle = ComputeAngle(p_angle->GetNumericValue());
	}

	if (p_color_stop_list->unit != Unit::COLORSTOPLIST)
		return nullptr;
	const ColorStopList& color_stop_list = p_color_stop_list->value.GetReference<ColorStopList>();
	const bool repeating = (name == "repeating-linear-gradient");

	auto decorator = MakeShared<DecoratorLinearGradient>();
	if (decorator->Initialise(repeating, corner, angle, color_stop_list))
		return decorator;

	return nullptr;
}